

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_spline.cpp
# Opt level: O2

ChQuaternion<double> * __thiscall
chrono::ChFunctionRotation_spline::Get_q
          (ChQuaternion<double> *__return_storage_ptr__,ChFunctionRotation_spline *this,double s)

{
  double *pdVar1;
  int iVar2;
  pointer pCVar3;
  int i;
  long lVar4;
  Scalar *pSVar5;
  int j;
  long lVar6;
  double u;
  undefined1 auVar7 [16];
  double local_118;
  ChVectorDynamic<> N;
  ChQuaternion<double> local_f8;
  ChQuaternion<double> q0;
  ChVector<double> local_b8;
  ChVector<double> v_1;
  ChQuaternion<double> qqpowBi;
  ChVector<double> v;
  
  (*((this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  if (this->closed == true) {
    s = fmod(s,1.0);
  }
  u = ComputeKnotUfromU(this,s);
  i = geometry::ChBasisToolsBspline::FindSpan(this->p,u,&this->knots);
  qqpowBi.m_data[0] = (double)CONCAT44(qqpowBi.m_data[0]._4_4_,this->p + 1);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&N,(int *)&qqpowBi);
  geometry::ChBasisToolsBspline::BasisEvaluate(this->p,i,u,&this->knots,&N);
  iVar2 = this->p;
  qqpowBi.m_data[0] = 0.0;
  qqpowBi.m_data[1] = 0.0;
  qqpowBi.m_data[2] = 0.0;
  qqpowBi.m_data[3] = 0.0;
  pCVar3 = (this->rotations).
           super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)i - (long)iVar2;
  q0.m_data[0] = pCVar3[lVar4].m_data[0];
  q0.m_data[1] = pCVar3[lVar4].m_data[1];
  q0.m_data[2] = pCVar3[lVar4].m_data[2];
  q0.m_data[3] = pCVar3[lVar4].m_data[3];
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  local_118 = 0.0;
  for (lVar4 = 0;
      lVar4 < N.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      lVar4 = lVar4 + 1) {
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&N,lVar4);
    local_118 = local_118 + *pSVar5;
  }
  ChQuaternion<double>::Q_to_Rotv((ChVector<double> *)&local_f8,&q0);
  v.m_data[0] = local_118 * local_f8.m_data[0];
  v.m_data[1] = local_118 * local_f8.m_data[1];
  v.m_data[2] = local_118 * local_f8.m_data[2];
  ChQuaternion<double>::Q_from_Rotv(__return_storage_ptr__,&v);
  lVar6 = (long)i * 0x20 + (long)iVar2 * -0x20;
  for (lVar4 = 1; lVar4 <= this->p; lVar4 = lVar4 + 1) {
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&N,lVar4 + -1)
    ;
    local_118 = local_118 - *pSVar5;
    pCVar3 = (this->rotations).
             super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f8.m_data[0] = *(double *)((long)pCVar3->m_data + lVar6);
    auVar7._0_8_ = *(ulong *)((long)pCVar3->m_data + lVar6 + 0x18) ^ 0x8000000000000000;
    auVar7._8_8_ = 0x8000000000000000;
    pdVar1 = (double *)((long)pCVar3->m_data + lVar6 + 8);
    local_f8.m_data[1] = -*pdVar1;
    local_f8.m_data[2] = -pdVar1[1];
    local_f8.m_data[3] = (double)vmovlpd_avx(auVar7);
    ChQuaternion<double>::operator*
              ((ChQuaternion<double> *)&v,&local_f8,
               (ChQuaternion<double> *)((long)pCVar3[1].m_data + lVar6));
    ChQuaternion<double>::Q_to_Rotv(&local_b8,(ChQuaternion<double> *)&v);
    v_1.m_data[0] = local_118 * local_b8.m_data[0];
    v_1.m_data[1] = local_118 * local_b8.m_data[1];
    v_1.m_data[2] = local_118 * local_b8.m_data[2];
    ChQuaternion<double>::Q_from_Rotv(&qqpowBi,&v_1);
    ChQuaternion<double>::operator*=(__return_storage_ptr__,&qqpowBi);
    lVar6 = lVar6 + 0x20;
  }
  Eigen::internal::handmade_aligned_free
            (N.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<> ChFunctionRotation_spline::Get_q(double s) const {
	
	double fs = space_fx->Get_y(s);

	double mU;
	if (this->closed)
		mU = fmod(fs, 1.0);
	else
		mU = fs;

    double u = ComputeKnotUfromU(mU);

    int spanU = geometry::ChBasisToolsBspline::FindSpan(this->p, u, this->knots);

    ChVectorDynamic<> N(this->p + 1);
    geometry::ChBasisToolsBspline::BasisEvaluate(this->p, spanU, u, this->knots, N);

	// Use the quaternion spline interpolation as in Kim & Kim 1995 paper, ie. with cumulative basis.
	// Note: now, instead of creating a ChVectorDynamic<> Bi(this->p + 1); vector containing all the basis
	// recomputed in cumulative form, we just use a single scalar Bi and update it only when needed.
	
    int uind = spanU - p;
	ChQuaternion<> qqpowBi;
	ChQuaternion<> q0 = rotations[uind + 0];  // q0
	ChQuaternion<> q; 
	double Bi = 0;
	// should be Bi(0) = 1 in most cases, anyway: compute first cumulative basis:
	for (int j = 0; j < N.size(); ++j)
		Bi += N(j);  
	q.Q_from_Rotv(q0.Q_to_Rotv() * Bi);

    for (int i = 1; i <= this->p; i++) {
		// update cumulative basis - avoids repeating the sums, as it should be:  Bi=0; for (int j = i; j < N.size(); ++j) {Bi += N(j);} 
		Bi -= N(i-1); 
		// compute delta rotation
		qqpowBi.Q_from_Rotv((rotations[uind + i - 1].GetConjugate() * rotations[uind + i]).Q_to_Rotv() * Bi);
		// apply delta rotation
		q *= qqpowBi;
    }

	return q;
}